

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::EnhancedLayouts::XFBGlobalBufferTest::getShaderSource_abi_cxx11_
          (string *__return_storage_ptr__,XFBGlobalBufferTest *this,GLuint test_case_index,
          STAGES stage)

{
  STAGES SVar1;
  reference pvVar2;
  GLchar *pGVar3;
  TestError *pTVar4;
  size_t local_c0;
  size_t position_1;
  size_t sStack_b0;
  GLuint type_size;
  size_t position;
  GLchar buffer [16];
  undefined1 local_90 [8];
  string interface;
  string local_68 [8];
  string assignments;
  GLchar *type_name;
  _testCase *test_case;
  STAGES stage_local;
  GLuint test_case_index_local;
  XFBGlobalBufferTest *this_local;
  string *source;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  pvVar2 = std::
           vector<gl4cts::EnhancedLayouts::XFBGlobalBufferTest::_testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBGlobalBufferTest::_testCase>_>
           ::operator[](&this->m_test_cases,(ulong)test_case_index);
  pGVar3 = Utils::Type::GetGLSLTypeName(&pvVar2->m_type);
  if (pvVar2->m_stage == stage) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_68,
               "    chichi       = uni_chichi;\n    bulma        = uni_bulma;\n    vegeta.trunk = uni_trunk;\n    vegeta.bra   = uni_bra;\n    goku.gohan   = uni_gohan;\n    goku.goten   = uni_goten;\n"
               ,(allocator<char> *)(interface.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(interface.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_90,
               "layout (xfb_buffer = 3) out;\n\nconst uint type_size = SIZE;\n\nlayout (                xfb_offset = 2 * type_size) flat out TYPE chichi;\nlayout (xfb_buffer = 1, xfb_offset = 0)             flat out TYPE bulma;\nlayout (xfb_buffer = 1, xfb_offset = 1 * type_size) out Vegeta {\n    TYPE trunk;\n    TYPE bra;\n} vegeta;\nlayout (                xfb_offset = 0)             out Goku {\n    TYPE gohan;\n    TYPE goten;\n} goku;\n\nlayout(binding = 0, std140) uniform block {\n    TYPE uni_chichi;\n    TYPE uni_bulma;\n    TYPE uni_trunk;\n    TYPE uni_bra;\n    TYPE uni_gohan;\n    TYPE uni_goten;\n};\n"
               ,(allocator<char> *)(buffer + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(buffer + 0xf));
    sStack_b0 = 0;
    position_1._4_4_ = Utils::Type::GetSize(&pvVar2->m_type);
    sprintf((char *)&position,"%d",(ulong)position_1._4_4_);
    Utils::replaceToken("SIZE",&stack0xffffffffffffff50,(GLchar *)&position,(string *)local_90);
    Utils::replaceAllTokens("TYPE",pGVar3,(string *)local_90);
    if (stage == VERTEX) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::vs_tested);
    }
    else if (stage == TESS_EVAL) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::tes);
    }
    else {
      if (stage != GEOMETRY) {
        pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar4,"Invalid enum",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                   ,0x5ebe);
        __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::gs);
    }
    local_c0 = 0;
    pGVar3 = (GLchar *)std::__cxx11::string::c_str();
    Utils::replaceToken("INTERFACE",&local_c0,pGVar3,__return_storage_ptr__);
    pGVar3 = (GLchar *)std::__cxx11::string::c_str();
    Utils::replaceToken("ASSIGNMENTS",&local_c0,pGVar3,__return_storage_ptr__);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string(local_68);
  }
  else {
    SVar1 = pvVar2->m_stage;
    if (SVar1 == VERTEX) {
      if (stage == FRAGMENT) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::fs);
        Utils::replaceAllTokens("TYPE",pGVar3,__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,"");
      }
    }
    else if (SVar1 == TESS_EVAL) {
      if (stage == VERTEX) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::vs);
      }
      else if (stage == TESS_CTRL) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::tcs);
      }
      else if (stage == FRAGMENT) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::fs);
        Utils::replaceAllTokens("TYPE",pGVar3,__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,"");
      }
    }
    else {
      if (SVar1 != GEOMETRY) {
        pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar4,"Invalid enum",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                   ,0x5ef8);
        __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      if (stage == VERTEX) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::vs);
      }
      else if (stage == FRAGMENT) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::fs);
        Utils::replaceAllTokens("TYPE",pGVar3,__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,"");
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string XFBGlobalBufferTest::getShaderSource(GLuint test_case_index, Utils::Shader::STAGES stage)
{
	static const GLchar* fs =
		"#version 430 core\n"
		"#extension GL_ARB_enhanced_layouts : require\n"
		"\n"
		"flat in TYPE chichi;\n"
		"flat in TYPE bulma;\n"
		"in Vegeta {\n"
		"    TYPE trunk;\n"
		"    TYPE bra;\n"
		"} vegeta;\n"
		"in Goku {\n"
		"    TYPE gohan;\n"
		"    TYPE goten;\n"
		"} goku;\n"
		"\n"
		"out vec4 fs_out;\n"
		"\n"
		"void main()\n"
		"{\n"
		"    fs_out = vec4(1);\n"
		"    if (TYPE(1) != chichi + bulma + vegeta.trunk + vegeta.bra + goku.gohan + goku.goten)\n"
		"    {\n"
		"        fs_out = vec4(0);\n"
		"    }\n"
		"}\n"
		"\n";

	static const GLchar* gs = "#version 430 core\n"
							  "#extension GL_ARB_enhanced_layouts : require\n"
							  "\n"
							  "layout(points)                   in;\n"
							  "layout(points, max_vertices = 1) out;\n"
							  "\n"
							  "INTERFACE"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "ASSIGNMENTS"
							  "    EmitVertex();\n"
							  "}\n"
							  "\n";

	static const GLchar* tcs = "#version 430 core\n"
							   "#extension GL_ARB_enhanced_layouts : require\n"
							   "\n"
							   "layout(vertices = 1) out;\n"
							   "\n"
							   "\n"
							   "void main()\n"
							   "{\n"
							   "    gl_TessLevelOuter[0] = 1.0;\n"
							   "    gl_TessLevelOuter[1] = 1.0;\n"
							   "    gl_TessLevelOuter[2] = 1.0;\n"
							   "    gl_TessLevelOuter[3] = 1.0;\n"
							   "    gl_TessLevelInner[0] = 1.0;\n"
							   "    gl_TessLevelInner[1] = 1.0;\n"
							   "}\n"
							   "\n";

	static const GLchar* tes = "#version 430 core\n"
							   "#extension GL_ARB_enhanced_layouts : require\n"
							   "\n"
							   "layout(isolines, point_mode) in;\n"
							   "\n"
							   "INTERFACE"
							   "\n"
							   "void main()\n"
							   "{\n"
							   "ASSIGNMENTS"
							   "}\n"
							   "\n";

	static const GLchar* vs = "#version 430 core\n"
							  "#extension GL_ARB_enhanced_layouts : require\n"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "}\n"
							  "\n";

	static const GLchar* vs_tested = "#version 430 core\n"
									 "#extension GL_ARB_enhanced_layouts : require\n"
									 "\n"
									 "INTERFACE"
									 "\n"
									 "void main()\n"
									 "{\n"
									 "ASSIGNMENTS"
									 "}\n"
									 "\n";

	std::string		 source;
	const _testCase& test_case = m_test_cases[test_case_index];
	const GLchar*	type_name = test_case.m_type.GetGLSLTypeName();

	if (test_case.m_stage == stage)
	{
		std::string assignments = "    chichi       = uni_chichi;\n"
								  "    bulma        = uni_bulma;\n"
								  "    vegeta.trunk = uni_trunk;\n"
								  "    vegeta.bra   = uni_bra;\n"
								  "    goku.gohan   = uni_gohan;\n"
								  "    goku.goten   = uni_goten;\n";

		std::string interface = "layout (xfb_buffer = 3) out;\n"
								"\n"
								"const uint type_size = SIZE;\n"
								"\n"
								"layout (                xfb_offset = 2 * type_size) flat out TYPE chichi;\n"
								"layout (xfb_buffer = 1, xfb_offset = 0)             flat out TYPE bulma;\n"
								"layout (xfb_buffer = 1, xfb_offset = 1 * type_size) out Vegeta {\n"
								"    TYPE trunk;\n"
								"    TYPE bra;\n"
								"} vegeta;\n"
								"layout (                xfb_offset = 0)             out Goku {\n"
								"    TYPE gohan;\n"
								"    TYPE goten;\n"
								"} goku;\n"
								"\n"
								// Uniform block must be declared with std140, otherwise each block member is not packed
								"layout(binding = 0, std140) uniform block {\n"
								"    TYPE uni_chichi;\n"
								"    TYPE uni_bulma;\n"
								"    TYPE uni_trunk;\n"
								"    TYPE uni_bra;\n"
								"    TYPE uni_gohan;\n"
								"    TYPE uni_goten;\n"
								"};\n";

		/* Prepare interface string */
		{
			GLchar		 buffer[16];
			size_t		 position  = 0;
			const GLuint type_size = test_case.m_type.GetSize();

			sprintf(buffer, "%d", type_size);

			Utils::replaceToken("SIZE", position, buffer, interface);
			Utils::replaceAllTokens("TYPE", type_name, interface);
		}

		switch (stage)
		{
		case Utils::Shader::GEOMETRY:
			source = gs;
			break;
		case Utils::Shader::TESS_EVAL:
			source = tes;
			break;
		case Utils::Shader::VERTEX:
			source = vs_tested;
			break;
		default:
			TCU_FAIL("Invalid enum");
		}

		/* Replace tokens */
		{
			size_t position = 0;

			Utils::replaceToken("INTERFACE", position, interface.c_str(), source);
			Utils::replaceToken("ASSIGNMENTS", position, assignments.c_str(), source);
		}
	}
	else
	{
		switch (test_case.m_stage)
		{
		case Utils::Shader::GEOMETRY:
			switch (stage)
			{
			case Utils::Shader::FRAGMENT:
				source = fs;
				Utils::replaceAllTokens("TYPE", type_name, source);
				break;
			case Utils::Shader::VERTEX:
				source = vs;
				break;
			default:
				source = "";
			}
			break;
		case Utils::Shader::TESS_EVAL:
			switch (stage)
			{
			case Utils::Shader::FRAGMENT:
				source = fs;
				Utils::replaceAllTokens("TYPE", type_name, source);
				break;
			case Utils::Shader::TESS_CTRL:
				source = tcs;
				break;
			case Utils::Shader::VERTEX:
				source = vs;
				break;
			default:
				source = "";
			}
			break;
		case Utils::Shader::VERTEX:
			switch (stage)
			{
			case Utils::Shader::FRAGMENT:
				source = fs;
				Utils::replaceAllTokens("TYPE", type_name, source);
				break;
			default:
				source = "";
			}
			break;
		default:
			TCU_FAIL("Invalid enum");
			break;
		}
	}

	return source;
}